

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

void BM_vlog(int n)

{
  bool bVar1;
  ostream *poVar2;
  uint uVar3;
  LogMessage local_90;
  
  if (0 < n) {
    uVar3 = n + 1;
    do {
      if (BM_vlog::vlocal__.level == (int32 *)0x0) {
        bVar1 = google::InitVLOG3__(&BM_vlog::vlocal__,&fLI::FLAGS_v,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                                    ,1);
        if (bVar1) goto LAB_0010aa6e;
      }
      else if (0 < *BM_vlog::vlocal__.level) {
LAB_0010aa6e:
        google::LogMessage::LogMessage
                  (&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                   ,0xb6);
        poVar2 = google::LogMessage::stream(&local_90);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"test message",0xc);
        google::LogMessage::~LogMessage(&local_90);
      }
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

static void BM_vlog(int n) {
  while (n-- > 0) {
    VLOG(1) << "test message";
  }
}